

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O2

void print_version(void)

{
  char *pcVar1;
  int revision;
  int minor;
  int major;
  
  glfwGetVersion(&major,&minor,&revision);
  printf("GLFW header version: %u.%u.%u\n",3,3,2);
  printf("GLFW library version: %u.%u.%u\n",(ulong)(uint)major,(ulong)(uint)minor,
         (ulong)(uint)revision);
  pcVar1 = glfwGetVersionString();
  printf("GLFW library version string: \"%s\"\n",pcVar1);
  return;
}

Assistant:

static void print_version(void)
{
    int major, minor, revision;
    glfwGetVersion(&major, &minor, &revision);

    printf("GLFW header version: %u.%u.%u\n",
           GLFW_VERSION_MAJOR,
           GLFW_VERSION_MINOR,
           GLFW_VERSION_REVISION);
    printf("GLFW library version: %u.%u.%u\n", major, minor, revision);
    printf("GLFW library version string: \"%s\"\n", glfwGetVersionString());
}